

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

value __thiscall merlin::factor::entropy(factor *this)

{
  pointer pdVar1;
  size_t i;
  ulong uVar2;
  double dVar3;
  double __x;
  double dVar4;
  double local_30;
  
  __x = 0.0;
  local_30 = 0.0;
  for (uVar2 = 0;
      pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    dVar4 = pdVar1[uVar2];
    dVar3 = ::log(dVar4);
    if (ABS(dVar3) != INFINITY) {
      local_30 = local_30 -
                 dVar3 * (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar2];
    }
    __x = __x + dVar4;
  }
  dVar4 = ::log(__x);
  return dVar4 + local_30 / __x;
}

Assistant:

value entropy(void) const {
		value H = 0, Z = 0;
		for (size_t i = 0; i < num_states(); i++) {
			Z += t_[i];
			double L = std::log(t_[i]);
			if (!isinf(L))
				H -= t_[i] * L; //std::log(t_[i]);
		}
		H /= Z;
		H += std::log(Z);
		return H;
	}